

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

void __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::createTextures
          (TextureBorderClampSamplingTexture<int,_int> *this)

{
  GLenum GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  undefined1 auVar5 [16];
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  allocator_type local_49;
  vector<int,_std::allocator<int>_> inputData;
  long lVar8;
  
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x6f8))(1,&this->m_input_to_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x107);
  (**(code **)(lVar8 + 0xb8))((this->m_test_configuration).m_target,this->m_input_to_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x10b);
  iVar6 = (this->m_test_configuration).m_n_in_components;
  GVar1 = (this->m_test_configuration).m_target;
  iVar12 = (this->m_test_configuration).m_height * (this->m_test_configuration).m_width *
           (this->m_test_configuration).m_depth;
  if ((GVar1 == 0x8c1a) || (GVar1 == 0x806f)) {
    (**(code **)(lVar8 + 0x1398))(GVar1,1,(this->m_test_configuration).m_input_internal_format);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x146);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<int,_std::allocator<int>_>::vector(&inputData,(long)(iVar12 * iVar6),&local_49);
      auVar5 = _DAT_019f5ce0;
      GVar3 = (this->m_test_configuration).m_width;
      GVar4 = (this->m_test_configuration).m_height;
      GVar2 = (this->m_test_configuration).m_depth;
      uVar9 = GVar4 * GVar3 * GVar2 * (this->m_test_configuration).m_n_in_components;
      if (uVar9 != 0) {
        iVar6 = (this->m_test_configuration).m_init_value;
        lVar10 = (ulong)uVar9 - 1;
        auVar13._8_4_ = (int)lVar10;
        auVar13._0_8_ = lVar10;
        auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar13 = auVar13 ^ _DAT_019f5ce0;
        auVar18 = _DAT_01a25df0;
        auVar15 = _DAT_019fcc00;
        do {
          auVar17 = auVar15 ^ auVar5;
          iVar12 = auVar13._4_4_;
          if ((bool)(~(auVar17._4_4_ == iVar12 && auVar13._0_4_ < auVar17._0_4_ ||
                      iVar12 < auVar17._4_4_) & 1)) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] = iVar6;
          }
          if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
              auVar17._12_4_ <= auVar13._12_4_) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 1] = iVar6;
          }
          auVar17 = auVar18 ^ auVar5;
          iVar19 = auVar17._4_4_;
          if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar17._0_4_ <= auVar13._0_4_)) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 2] = iVar6;
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 3] = iVar6;
          }
          uVar11 = uVar11 + 4;
          lVar10 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 4;
          auVar15._8_8_ = lVar10 + 4;
          lVar10 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 4;
          auVar18._8_8_ = lVar10 + 4;
        } while (((ulong)uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
        GVar3 = (this->m_test_configuration).m_width;
        GVar4 = (this->m_test_configuration).m_height;
        GVar2 = (this->m_test_configuration).m_depth;
      }
      (**(code **)(lVar8 + 0x13c0))
                ((this->m_test_configuration).m_target,0,0,0,0,GVar3,GVar4,GVar2,
                 (this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x167);
      goto LAB_00cd49b3;
    }
    (**(code **)(lVar8 + 0x2b0))
              ((this->m_test_configuration).m_target,0,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,(this->m_test_configuration).m_depth,0x9278,
               0x6000,"");
    dVar7 = (**(code **)(lVar8 + 0x800))();
    iVar6 = 0x155;
  }
  else {
    if (GVar1 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D!"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x16d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar8 + 0x1380))(0xde1,1,(this->m_test_configuration).m_input_internal_format);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"Error allocating storage for texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x11c);
    if ((this->m_test_configuration).m_input_internal_format != 0x9278) {
      std::vector<int,_std::allocator<int>_>::vector(&inputData,(long)(iVar12 * iVar6),&local_49);
      auVar5 = _DAT_019f5ce0;
      GVar3 = (this->m_test_configuration).m_width;
      GVar4 = (this->m_test_configuration).m_height;
      uVar9 = GVar4 * GVar3 * (this->m_test_configuration).m_depth *
              (this->m_test_configuration).m_n_in_components;
      if (uVar9 != 0) {
        iVar6 = (this->m_test_configuration).m_init_value;
        lVar10 = (ulong)uVar9 - 1;
        auVar14._8_4_ = (int)lVar10;
        auVar14._0_8_ = lVar10;
        auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar14 = auVar14 ^ _DAT_019f5ce0;
        auVar17 = _DAT_01a25df0;
        auVar16 = _DAT_019fcc00;
        do {
          auVar18 = auVar16 ^ auVar5;
          iVar12 = auVar14._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar12 && auVar14._0_4_ < auVar18._0_4_ ||
                      iVar12 < auVar18._4_4_) & 1)) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] = iVar6;
          }
          if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
              auVar18._12_4_ <= auVar14._12_4_) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 1] = iVar6;
          }
          auVar18 = auVar17 ^ auVar5;
          iVar19 = auVar18._4_4_;
          if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar18._0_4_ <= auVar14._0_4_)) {
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 2] = iVar6;
            inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11 + 3] = iVar6;
          }
          uVar11 = uVar11 + 4;
          lVar10 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar10 + 4;
          lVar10 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 4;
          auVar17._8_8_ = lVar10 + 4;
        } while (((ulong)uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
        GVar3 = (this->m_test_configuration).m_width;
        GVar4 = (this->m_test_configuration).m_height;
      }
      (**(code **)(lVar8 + 0x13b8))
                ((this->m_test_configuration).m_target,0,0,0,GVar3,GVar4,
                 (this->m_test_configuration).m_input_format,
                 (this->m_test_configuration).m_input_type,
                 inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar7 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar7,"Error filling texture with data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x139);
LAB_00cd49b3:
      if (inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)inputData.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_00cd49ca;
    }
    (**(code **)(lVar8 + 0x2a8))
              ((this->m_test_configuration).m_target,0,0,0,(this->m_test_configuration).m_width,
               (this->m_test_configuration).m_height,0x9278,0x1000,"");
    dVar7 = (**(code **)(lVar8 + 0x800))();
    iVar6 = 0x129;
  }
  glu::checkError(dVar7,"Error filling texture with compressed data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,iVar6);
LAB_00cd49ca:
  (**(code **)(lVar8 + 0x6f8))(1,&this->m_output_to_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x173);
  (**(code **)(lVar8 + 0xb8))(0xde1,this->m_output_to_id);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x177);
  (**(code **)(lVar8 + 0x1380))
            (0xde1,1,(this->m_test_configuration).m_output_internal_format,
             (this->m_test_configuration).m_width,(this->m_test_configuration).m_height);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x17c);
  return;
}

Assistant:

void TextureBorderClampSamplingTexture<InputType, OutputType>::createTextures(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate input texture */
	gl.genTextures(1, &m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind input texture */
	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLsizei components = m_test_configuration.get_n_in_components();
	glw::GLsizei texelsNumber =
		m_test_configuration.get_width() * m_test_configuration.get_height() * m_test_configuration.get_depth();

	/* Allocate storage for input texture and fill it with data */
	{
		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat */
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height());				  /* height */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage2D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D),				 /* image size */
										   compressed_image_data_2D);						 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage2D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		case GL_TEXTURE_2D_ARRAY:
		case GL_TEXTURE_3D:
		{
			gl.texStorage3D(m_test_configuration.get_target(),				  /* target */
							1,												  /* levels */
							m_test_configuration.get_input_internal_format(), /* internalformat*/
							m_test_configuration.get_width(),				  /* width */
							m_test_configuration.get_height(),				  /* height */
							m_test_configuration.get_depth());				  /* depth */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

			if (m_test_configuration.get_input_internal_format() == GL_COMPRESSED_RGBA8_ETC2_EAC)
			{
				gl.compressedTexSubImage3D(m_test_configuration.get_target(),				 /* target */
										   0,												 /* level */
										   0,												 /* xoffset */
										   0,												 /* yoffset */
										   0,												 /* zoffset */
										   m_test_configuration.get_width(),				 /* width */
										   m_test_configuration.get_height(),				 /* height */
										   m_test_configuration.get_depth(),				 /* depth */
										   m_test_configuration.get_input_internal_format(), /* internalformat */
										   sizeof(compressed_image_data_2D_array),			 /* image size */
										   compressed_image_data_2D_array);					 /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with compressed data!");
			}
			else
			{
				std::vector<InputType> inputData(components * texelsNumber);
				setInitData(inputData);

				gl.texSubImage3D(m_test_configuration.get_target(),		  /* target */
								 0,										  /* level */
								 0,										  /* xoffset */
								 0,										  /* yoffset */
								 0,										  /* zoffset */
								 m_test_configuration.get_width(),		  /* width */
								 m_test_configuration.get_height(),		  /* height */
								 m_test_configuration.get_depth(),		  /* depth */
								 m_test_configuration.get_input_format(), /* format */
								 m_test_configuration.get_input_type(),   /* type */
								 &inputData[0]);						  /* data */
				GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture with data!");
			}
			break;
		}
		default:
			TCU_FAIL("Test parameters can contain only following targets: GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, "
					 "GL_TEXTURE_3D!");
		}
	}

	/* Generate output texture */
	gl.genTextures(1, &m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	/* Bind output texture */
	gl.bindTexture(GL_TEXTURE_2D, m_output_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	/* Allocate storage for output texture */
	gl.texStorage2D(GL_TEXTURE_2D, 1, m_test_configuration.get_output_internal_format(),
					m_test_configuration.get_width(), m_test_configuration.get_height());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");
}